

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.cpp
# Opt level: O0

void get_normalized_boundaries(Fp *fp,Fp *lower,Fp *upper)

{
  int iVar1;
  int l_shift;
  int u_shift;
  Fp *upper_local;
  Fp *lower_local;
  Fp *fp_local;
  
  upper->frac = fp->frac * 2 + 1;
  upper->exp = fp->exp + -1;
  while ((upper->frac & 0x20000000000000) == 0) {
    upper->frac = upper->frac << 1;
    upper->exp = upper->exp + -1;
  }
  upper->frac = upper->frac << 10;
  upper->exp = upper->exp + -10;
  iVar1 = 1;
  if (fp->frac == 0x10000000000000) {
    iVar1 = 2;
  }
  lower->frac = (fp->frac << (sbyte)iVar1) - 1;
  lower->exp = fp->exp - iVar1;
  lower->frac = lower->frac << ((char)lower->exp - (char)upper->exp & 0x3fU);
  lower->exp = upper->exp;
  return;
}

Assistant:

static void get_normalized_boundaries(Fp* fp, Fp* lower, Fp* upper) {
  upper->frac = (fp->frac << 1) + 1;
  upper->exp = fp->exp - 1;

  while ((upper->frac & (hiddenbit << 1)) == 0) {
    upper->frac <<= 1;
    upper->exp--;
  }

  int u_shift = 64 - 52 - 2;

  upper->frac <<= u_shift;
  upper->exp = upper->exp - u_shift;

  int l_shift = fp->frac == hiddenbit ? 2 : 1;

  lower->frac = (fp->frac << l_shift) - 1;
  lower->exp = fp->exp - l_shift;

  lower->frac <<= lower->exp - upper->exp;
  lower->exp = upper->exp;
}